

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  bool bVar1;
  __type _Var2;
  ParseArgumentStatus PVar3;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  ostream *poVar7;
  pointer ppVar8;
  pointer pOVar9;
  ulong uVar10;
  byte local_291;
  undefined1 local_1e0 [7];
  bool decoding_raw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string plugin_name;
  __normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
  local_118;
  __normal_iterator<const_google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
  local_110;
  const_iterator j;
  iterator iStack_100;
  bool foundImplicitPlugin;
  _Self local_f8;
  iterator local_f0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  iterator local_e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  const_iterator i_2;
  int iStack_c4;
  bool foundUnknownPluginOption;
  ParseArgumentStatus status;
  string value;
  string name;
  int i_1;
  allocator local_69;
  value_type local_68;
  int local_44;
  undefined1 local_40 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  char **argv_local;
  int argc_local;
  CommandLineInterface *this_local;
  
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::__cxx11::string::operator=((string *)this,*argv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  for (local_44 = 1; local_44 < argc; local_44 = local_44 + 1) {
    pcVar5 = *(char **)(&(arguments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                       (long)local_44 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,pcVar5,&local_69);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  for (name.field_2._8_4_ = 0;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40), (ulong)(long)(int)name.field_2._8_4_ < sVar4;
      name.field_2._8_4_ = name.field_2._8_4_ + 1) {
    std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&status);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40,(long)(int)name.field_2._8_4_);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = ParseArgument(this,pcVar5,(string *)(value.field_2._M_local_buf + 8),(string *)&status);
    if (bVar1) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      if ((long)(name.field_2._8_4_ + 1) != sVar4) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(long)(name.field_2._8_4_ + 1));
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar6);
        if (*pcVar5 != '-') {
          name.field_2._8_4_ = name.field_2._8_4_ + 1;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,(long)(int)name.field_2._8_4_);
          std::__cxx11::string::operator=((string *)&status,(string *)pvVar6);
          goto LAB_0035985f;
        }
      }
      poVar7 = std::operator<<((ostream *)&std::cerr,"Missing value for flag: ");
      poVar7 = std::operator<<(poVar7,(string *)(value.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&value.field_2 + 8),"--decode");
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "To decode an unknown message, use --decode_raw.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      bVar1 = true;
    }
    else {
LAB_0035985f:
      PVar3 = InterpretArgument(this,(string *)((long)&value.field_2 + 8),(string *)&status);
      if (PVar3 == PARSE_ARGUMENT_DONE_AND_CONTINUE) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        this_local._4_4_ = PVar3;
      }
    }
    std::__cxx11::string::~string((string *)&status);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    if (bVar1) goto LAB_0035a07b;
  }
  i_2._M_node._7_1_ = 0;
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(&this->plugin_parameters_);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_d8,&local_e0);
  while( true ) {
    local_f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->plugin_parameters_);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_e8,&local_f0);
    bVar1 = std::operator!=(&local_d8,&local_e8);
    if (!bVar1) break;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_d8);
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->plugins_,&ppVar8->first);
    iStack_100 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(&this->plugins_);
    bVar1 = std::operator!=(&local_f8,&stack0xffffffffffffff00);
    if (!bVar1) {
      j._M_current._7_1_ = 0;
      local_118._M_current =
           (OutputDirective *)
           std::
           vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ::begin(&this->output_directives_);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_const*,std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>>>
      ::__normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective*>
                ((__normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_const*,std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>>>
                  *)&local_110,&local_118);
      while( true ) {
        plugin_name.field_2._8_8_ =
             std::
             vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ::end(&this->output_directives_);
        bVar1 = __gnu_cxx::operator!=
                          (&local_110,
                           (__normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
                            *)((long)&plugin_name.field_2 + 8));
        if (!bVar1) break;
        pOVar9 = __gnu_cxx::
                 __normal_iterator<const_google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
                 ::operator->(&local_110);
        if (pOVar9->generator == (CodeGenerator *)0x0) {
          pOVar9 = __gnu_cxx::
                   __normal_iterator<const_google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
                   ::operator->(&local_110);
          anon_unknown_0::PluginName((string *)local_140,&this->plugin_prefix_,&pOVar9->name);
          ppVar8 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_d8);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_140,&ppVar8->first);
          if (_Var2) {
            j._M_current._7_1_ = 1;
            iStack_c4 = 0xb;
          }
          else {
            iStack_c4 = 0;
          }
          std::__cxx11::string::~string((string *)local_140);
          if (iStack_c4 != 0) break;
        }
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
        ::operator++(&local_110);
      }
      if ((j._M_current._7_1_ & 1) == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_d8);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&local_1a0,(ulong)ppVar8);
        std::operator+(&local_180,"--",&local_1a0);
        std::operator+(&local_160,&local_180,"_opt");
        poVar7 = std::operator<<(poVar7,(string *)&local_160);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        i_2._M_node._7_1_ = 1;
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_d8);
  }
  if ((i_2._M_node._7_1_ & 1) == 0) {
    bVar1 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->proto_path_);
    if (bVar1) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1e0,(char (*) [1])0x5d3f83,(char (*) [2])0x5dcadc);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&this->proto_path_,(value_type *)local_1e0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1e0);
    }
    local_291 = 0;
    if (this->mode_ == MODE_DECODE) {
      local_291 = std::__cxx11::string::empty();
    }
    if (((local_291 & 1) == 0) ||
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->input_files_), bVar1)) {
      if (((local_291 & 1) == 0) &&
         (bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->input_files_), bVar1)) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Missing input file.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      }
      else if (((this->mode_ == MODE_COMPILE) &&
               (bVar1 = std::
                        vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                        ::empty(&this->output_directives_), bVar1)) &&
              (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Missing output directives.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      }
      else if ((this->mode_ == MODE_COMPILE) ||
              (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)) {
        uVar10 = std::__cxx11::string::empty();
        if (((uVar10 & 1) == 0) &&
           (sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&this->input_files_), 1 < sVar4)) {
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Can only process one input file when using --dependency_out=FILE."
                                  );
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = PARSE_ARGUMENT_FAIL;
        }
        else {
          if (((this->imports_in_descriptor_set_ & 1U) != 0) &&
             (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)) {
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "--include_imports only makes sense when combined with --descriptor_set_out."
                                    );
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          if (((this->source_info_in_descriptor_set_ & 1U) != 0) &&
             (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)) {
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "--include_source_info only makes sense when combined with --descriptor_set_out."
                                    );
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          this_local._4_4_ = PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "Can only use --dependency_out=FILE when generating code.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "When using --decode_raw, no input files should be given.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
    }
  }
  else {
    this_local._4_4_ = PARSE_ARGUMENT_FAIL;
  }
LAB_0035a07b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return this_local._4_4_;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::ParseArguments(int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<string> arguments;
  for (int i = 1; i < argc; ++i) {
    arguments.push_back(argv[i]);
  }

  // Iterate through all arguments and parse them.
  for (int i = 0; i < arguments.size(); ++i) {
    string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE)
      return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (std::map<string, string>::const_iterator i = plugin_parameters_.begin();
       i != plugin_parameters_.end(); ++i) {
    if (plugins_.find(i->first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (std::vector<OutputDirective>::const_iterator j = output_directives_.begin();
         j != output_directives_.end(); ++j) {
      if (j->generator == NULL) {
        string plugin_name = PluginName(plugin_prefix_ , j->name);
        if (plugin_name == i->first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }
    if (!foundImplicitPlugin) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" + i->first.substr(plugin_prefix_.size() + 4) + "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // If no --proto_path was given, use the current working directory.
  if (proto_path_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<string, string>("", "."));
  }

  // Check some errror cases.
  bool decoding_raw = (mode_ == MODE_DECODE) && codec_type_.empty();
  if (decoding_raw && !input_files_.empty()) {
    std::cerr << "When using --decode_raw, no input files should be given."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  } else if (!decoding_raw && input_files_.empty()) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out." << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out." << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}